

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::BackgroundReleasePagesSweep
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,Recycler *recycler)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  IdleDecommitPageAllocator *this_00;
  PageSegment *segment;
  char *address;
  Recycler *recycler_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  pcVar1 = (this->super_HeapBlock).address;
  uVar2 = GetPageCount(this);
  uVar3 = GetUnusablePageCount(this);
  HeapBlockMap64::ClearHeapBlock(&recycler->heapBlockMap,pcVar1,(ulong)(uVar2 - uVar3));
  pcVar1 = (this->super_HeapBlock).address;
  uVar2 = GetUnusablePageCount(this);
  if (uVar2 != 0) {
    RestoreUnusablePages(this);
  }
  this_00 = GetPageAllocator(this);
  uVar2 = GetPageCount(this);
  segment = GetPageSegment(this);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::BackgroundReleasePages(&this_00->super_PageAllocator,pcVar1,uVar2,segment);
  (this->super_HeapBlock).address = (char *)0x0;
  (this->super_HeapBlock).segment = (Segment *)0x0;
  Reset(this);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::BackgroundReleasePagesSweep(Recycler* recycler)
{
    recycler->heapBlockMap.ClearHeapBlock(address, this->GetPageCount() - this->GetUnusablePageCount());
    char* address = this->address;

    if (this->GetUnusablePageCount() > 0)
    {
        this->RestoreUnusablePages();
    }
    this->GetPageAllocator()->BackgroundReleasePages(address, this->GetPageCount(), this->GetPageSegment());

    this->address = nullptr;
    this->segment = nullptr;
    this->Reset();
}